

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constpool.cpp
# Opt level: O2

Error __thiscall asmjit::ConstPool::add(ConstPool *this,void *data,size_t size,size_t *dstOffset)

{
  Gap *pGVar1;
  Zone *pZVar2;
  long lVar3;
  Error EVar4;
  Node *pNVar5;
  ulong uVar6;
  size_t sVar7;
  long lVar8;
  uint8_t *puVar9;
  long lVar10;
  size_t offset;
  void *data_00;
  long lVar11;
  bool bVar12;
  long lStack_70;
  
  EVar4 = 3;
  switch(size) {
  case 1:
    lStack_70 = 0;
    break;
  case 2:
    lStack_70 = 1;
    break;
  case 3:
  case 5:
  case 6:
  case 7:
    goto switchD_00150741_caseD_3;
  case 4:
    lStack_70 = 2;
    break;
  case 8:
    lStack_70 = 3;
    break;
  default:
    if (size == 0x20) {
      lStack_70 = 5;
    }
    else {
      if (size != 0x10) {
        return 3;
      }
      lStack_70 = 4;
    }
  }
  pNVar5 = Tree::get(this->_tree + lStack_70,data);
  if (pNVar5 == (Node *)0x0) {
    offset = 0xffffffffffffffff;
    for (lVar10 = lStack_70 + -5; lVar10 != 0; lVar10 = lVar10 + 1) {
      pGVar1 = this->_gaps[lStack_70];
      if (pGVar1 != (Gap *)0x0) {
        offset = pGVar1->_offset;
        sVar7 = pGVar1->_length;
        this->_gaps[lStack_70] = pGVar1->_next;
        pGVar1->_next = this->_gapPool;
        this->_gapPool = pGVar1;
        if (offset % size != 0) {
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/constpool.cpp"
                     ,0x101,"Utils::isAligned<size_t>(offset, size)");
        }
        sVar7 = sVar7 - size;
        if (sVar7 != 0) {
          ConstPool_addGap(this,offset,sVar7);
        }
      }
    }
    if (offset == 0xffffffffffffffff) {
      offset = this->_size;
      sVar7 = (-size & (size - 1) + offset) - offset;
      if (sVar7 != 0) {
        ConstPool_addGap(this,offset,sVar7);
        offset = sVar7 + this->_size;
      }
      this->_size = offset + size;
    }
    pZVar2 = this->_zone;
    pNVar5 = (Node *)pZVar2->_ptr;
    if ((ulong)((long)pZVar2->_end - (long)pNVar5) < size + 0x18) {
      pNVar5 = (Node *)Zone::_alloc(pZVar2,size + 0x18);
    }
    else {
      puVar9 = (uint8_t *)((long)pNVar5[1]._link + size);
      pZVar2->_ptr = puVar9;
      if (pZVar2->_end < puVar9) {
LAB_001509da:
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/../base/../base/zone.h"
                   ,0x9b,"_ptr <= _end");
      }
    }
    if (pNVar5 == (Node *)0x0) {
      return 1;
    }
    pNVar5->_link[0] = (Node *)0x0;
    pNVar5->_link[1] = (Node *)0x0;
    *(undefined4 *)&pNVar5->field_0x10 = 1;
    pNVar5->_offset = (uint32_t)offset;
    memcpy(pNVar5 + 1,data,size);
    Tree::put(this->_tree + lStack_70,pNVar5);
    uVar6 = this->_alignment;
    if (this->_alignment <= size) {
      uVar6 = size;
    }
    this->_alignment = uVar6;
    *dstOffset = offset;
    lVar10 = 1;
    while (4 < size) {
      lVar11 = lStack_70 + -1;
      if (lStack_70 == 0) {
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/constpool.cpp"
                   ,0x12a,"treeIndex != 0");
      }
      lVar3 = lStack_70 + -1;
      uVar6 = offset & 0xffffffff;
      size = size >> 1;
      lVar10 = lVar10 * 2;
      lVar8 = lVar10;
      data_00 = data;
      while (bVar12 = lVar8 != 0, lVar8 = lVar8 + -1, lStack_70 = lVar11, bVar12) {
        pNVar5 = Tree::get(this->_tree + lVar3,data_00);
        if (pNVar5 == (Node *)0x0) {
          pZVar2 = this->_zone;
          pNVar5 = (Node *)pZVar2->_ptr;
          if ((ulong)((long)pZVar2->_end - (long)pNVar5) < size + 0x18) {
            pNVar5 = (Node *)Zone::_alloc(pZVar2,size + 0x18);
          }
          else {
            puVar9 = (uint8_t *)((long)pNVar5[1]._link + size);
            pZVar2->_ptr = puVar9;
            if (pZVar2->_end < puVar9) goto LAB_001509da;
          }
          if (pNVar5 != (Node *)0x0) {
            pNVar5->_link[0] = (Node *)0x0;
            pNVar5->_link[1] = (Node *)0x0;
            *(undefined4 *)&pNVar5->field_0x10 = 0x80000001;
            pNVar5->_offset = (uint32_t)uVar6;
            memcpy(pNVar5 + 1,data_00,size);
          }
          Tree::put(this->_tree + lVar3,pNVar5);
        }
        data_00 = (void *)((long)data_00 + size);
        uVar6 = (ulong)((uint32_t)uVar6 + (int)size);
      }
    }
  }
  else {
    *dstOffset = (ulong)pNVar5->_offset;
  }
  EVar4 = 0;
switchD_00150741_caseD_3:
  return EVar4;
}

Assistant:

Error ConstPool::add(const void* data, size_t size, size_t& dstOffset) noexcept {
  size_t treeIndex;

  if (size == 32)
    treeIndex = kIndex32;
  else if (size == 16)
    treeIndex = kIndex16;
  else if (size == 8)
    treeIndex = kIndex8;
  else if (size == 4)
    treeIndex = kIndex4;
  else if (size == 2)
    treeIndex = kIndex2;
  else if (size == 1)
    treeIndex = kIndex1;
  else
    return DebugUtils::errored(kErrorInvalidArgument);

  ConstPool::Node* node = _tree[treeIndex].get(data);
  if (node) {
    dstOffset = node->_offset;
    return kErrorOk;
  }

  // Before incrementing the current offset try if there is a gap that can
  // be used for the requested data.
  size_t offset = ~static_cast<size_t>(0);
  size_t gapIndex = treeIndex;

  while (gapIndex != kIndexCount - 1) {
    ConstPool::Gap* gap = _gaps[treeIndex];

    // Check if there is a gap.
    if (gap) {
      size_t gapOffset = gap->_offset;
      size_t gapLength = gap->_length;

      // Destroy the gap for now.
      _gaps[treeIndex] = gap->_next;
      ConstPool_freeGap(this, gap);

      offset = gapOffset;
      ASMJIT_ASSERT(Utils::isAligned<size_t>(offset, size));

      gapLength -= size;
      if (gapLength > 0)
        ConstPool_addGap(this, gapOffset, gapLength);
    }

    gapIndex++;
  }

  if (offset == ~static_cast<size_t>(0)) {
    // Get how many bytes have to be skipped so the address is aligned accordingly
    // to the 'size'.
    size_t diff = Utils::alignDiff<size_t>(_size, size);

    if (diff != 0) {
      ConstPool_addGap(this, _size, diff);
      _size += diff;
    }

    offset = _size;
    _size += size;
  }

  // Add the initial node to the right index.
  node = ConstPool::Tree::_newNode(_zone, data, size, offset, false);
  if (!node) return DebugUtils::errored(kErrorNoHeapMemory);

  _tree[treeIndex].put(node);
  _alignment = std::max<size_t>(_alignment, size);

  dstOffset = offset;

  // Now create a bunch of shared constants that are based on the data pattern.
  // We stop at size 4, it probably doesn't make sense to split constants down
  // to 1 byte.
  size_t pCount = 1;
  while (size > 4) {
    size >>= 1;
    pCount <<= 1;

    ASMJIT_ASSERT(treeIndex != 0);
    treeIndex--;

    const uint8_t* pData = static_cast<const uint8_t*>(data);
    for (size_t i = 0; i < pCount; i++, pData += size) {
      node = _tree[treeIndex].get(pData);
      if (node) continue;

      node = ConstPool::Tree::_newNode(_zone, pData, size, offset + (i * size), true);
      _tree[treeIndex].put(node);
    }
  }

  return kErrorOk;
}